

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O2

void in_memory_snapshot_cleanup_test(void)

{
  fdb_status fVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  char *__format;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_doc *doc;
  fdb_doc *rdoc;
  fdb_kvs_handle *snap_db3;
  fdb_kvs_handle *snap_db2;
  fdb_kvs_handle *snap_db1;
  fdb_kvs_handle *psnap_db3;
  fdb_kvs_handle *psnap_db2;
  fdb_kvs_handle *psnap_db1;
  fdb_kvs_config kvs_config;
  char bodybuf [32];
  char metabuf [32];
  char keybuf [32];
  timeval __test_begin;
  char newKey [32];
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  doc = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.wal_threshold = 0x400;
  fconfig.flags = 1;
  fconfig.compaction_threshold = '\0';
  fconfig.block_reusing_threshold = 0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fVar1 = fdb_open(&dbfile,"./mvcc_test1",&fconfig);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x464);
    in_memory_snapshot_cleanup_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x464,"void in_memory_snapshot_cleanup_test()");
  }
  fVar1 = fdb_kvs_open_default(dbfile,&db,&kvs_config);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x466);
    in_memory_snapshot_cleanup_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x466,"void in_memory_snapshot_cleanup_test()");
  }
  fVar1 = fdb_set_log_callback(db,logCallbackFunc,"in_memory_snapshot_cleanup_test");
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x46a);
    in_memory_snapshot_cleanup_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x46a,"void in_memory_snapshot_cleanup_test()");
  }
  builtin_strncpy(keybuf,"key",4);
  builtin_strncpy(metabuf,"meta",5);
  builtin_strncpy(bodybuf,"body",5);
  sVar2 = strlen(keybuf);
  sVar3 = strlen(metabuf);
  sVar4 = strlen(bodybuf);
  fdb_doc_create(&doc,keybuf,sVar2,metabuf,sVar3,bodybuf,sVar4);
  fdb_set(db,doc);
  fdb_commit(dbfile,'\0');
  fVar1 = fdb_snapshot_open(db,&snap_db1,0xffffffffffffffff);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x477);
    in_memory_snapshot_cleanup_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x477,"void in_memory_snapshot_cleanup_test()");
  }
  fVar1 = fdb_set(db,doc);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x47a);
    in_memory_snapshot_cleanup_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x47a,"void in_memory_snapshot_cleanup_test()");
  }
  fVar1 = fdb_commit(dbfile,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x47e);
    in_memory_snapshot_cleanup_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x47e,"void in_memory_snapshot_cleanup_test()");
  }
  fVar1 = fdb_snapshot_open(db,&snap_db2,0xffffffffffffffff);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x481);
    in_memory_snapshot_cleanup_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x481,"void in_memory_snapshot_cleanup_test()");
  }
  fVar1 = fdb_set(db,doc);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x484);
    in_memory_snapshot_cleanup_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x484,"void in_memory_snapshot_cleanup_test()");
  }
  fVar1 = fdb_commit(dbfile,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x488);
    in_memory_snapshot_cleanup_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x488,"void in_memory_snapshot_cleanup_test()");
  }
  fVar1 = fdb_set(db,doc);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x48b);
    in_memory_snapshot_cleanup_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x48b,"void in_memory_snapshot_cleanup_test()");
  }
  fVar1 = fdb_commit(dbfile,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x48f);
    in_memory_snapshot_cleanup_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x48f,"void in_memory_snapshot_cleanup_test()");
  }
  fdb_doc_free(doc);
  builtin_strncpy(newKey,"Key",4);
  sVar2 = strlen(newKey);
  sVar3 = strlen(metabuf);
  sVar4 = strlen(bodybuf);
  fdb_doc_create(&doc,newKey,sVar2,metabuf,sVar3,bodybuf,sVar4);
  fdb_set(db,doc);
  fVar1 = fdb_snapshot_open(db,&snap_db3,0xffffffffffffffff);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x49b);
    in_memory_snapshot_cleanup_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x49b,"void in_memory_snapshot_cleanup_test()");
  }
  sVar2 = strlen(keybuf);
  fdb_doc_create(&rdoc,keybuf,sVar2,(void *)0x0,0,(void *)0x0,0);
  fVar1 = fdb_get(snap_db1,rdoc);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x4a0);
    in_memory_snapshot_cleanup_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x4a0,"void in_memory_snapshot_cleanup_test()");
  }
  fVar1 = fdb_get(snap_db2,rdoc);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x4a3);
    in_memory_snapshot_cleanup_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x4a3,"void in_memory_snapshot_cleanup_test()");
  }
  fVar1 = fdb_get(snap_db3,rdoc);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x4a6);
    in_memory_snapshot_cleanup_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x4a6,"void in_memory_snapshot_cleanup_test()");
  }
  fdb_doc_free(rdoc);
  fVar1 = fdb_snapshot_open(db,&psnap_db1,1);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_snapshot_open(db,&psnap_db2,2);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x4ae);
      in_memory_snapshot_cleanup_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x4ae,"void in_memory_snapshot_cleanup_test()");
    }
    fVar1 = fdb_snapshot_open(db,&psnap_db3,3);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fdb_kvs_close(snap_db1);
      fdb_kvs_close(snap_db2);
      fdb_kvs_close(snap_db3);
      fVar1 = fdb_commit(dbfile,'\x01');
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fdb_kvs_close(psnap_db1);
        fdb_kvs_close(psnap_db2);
        fdb_kvs_close(psnap_db3);
        fdb_kvs_close(db);
        fdb_close(dbfile);
        fdb_doc_free(doc);
        fdb_shutdown();
        memleak_end();
        __format = "%s PASSED\n";
        if (in_memory_snapshot_cleanup_test()::__test_pass != '\0') {
          __format = "%s FAILED\n";
        }
        fprintf(_stderr,__format,"in-memory snapshot cleanup test");
        return;
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x4ba);
      in_memory_snapshot_cleanup_test()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x4ba,"void in_memory_snapshot_cleanup_test()");
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x4b1);
    in_memory_snapshot_cleanup_test()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x4b1,"void in_memory_snapshot_cleanup_test()");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x4ab);
  in_memory_snapshot_cleanup_test()::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x4ab,"void in_memory_snapshot_cleanup_test()");
}

Assistant:

void in_memory_snapshot_cleanup_test()
{
    TEST_INIT();

    memleak_start();

    int r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_handle *snap_db1, *snap_db2, *snap_db3;
    fdb_kvs_handle *psnap_db1, *psnap_db2, *psnap_db3;
    fdb_doc *doc = NULL;
    fdb_doc *rdoc;
    fdb_status status;

    char keybuf[32], metabuf[32], bodybuf[32];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 0;

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    // open db
    status = fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "in_memory_snapshot_cleanup_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    sprintf(keybuf, "key");
    sprintf(metabuf, "meta");
    sprintf(bodybuf, "body");
    fdb_doc_create(&doc, (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
    fdb_set(db, doc);

    // commit without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    status = fdb_snapshot_open(db, &snap_db1, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set(db, doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // commit without a WAL flush
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_snapshot_open(db, &snap_db2, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set(db, doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // commit without a WAL flush
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set(db, doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // commit without a WAL flush
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_doc_free(doc);

    // Update doc with new Key
    char newKey[32];
    sprintf(newKey, "Key");
    fdb_doc_create(&doc, (void*)newKey, strlen(newKey),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
    fdb_set(db, doc);

    status = fdb_snapshot_open(db, &snap_db3, FDB_SNAPSHOT_INMEM);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_doc_create(&rdoc, (void*)keybuf, strlen(keybuf), NULL, 0, NULL, 0);

    status = fdb_get(snap_db1, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get(snap_db2, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get(snap_db3, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_doc_free(rdoc);

    status = fdb_snapshot_open(db, &psnap_db1, 1);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_snapshot_open(db, &psnap_db2, 2);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_snapshot_open(db, &psnap_db3, 3);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close snapshot handle
    fdb_kvs_close(snap_db1);
    fdb_kvs_close(snap_db2);
    fdb_kvs_close(snap_db3);

    // commit without a WAL flush
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_kvs_close(psnap_db1);
    fdb_kvs_close(psnap_db2);
    fdb_kvs_close(psnap_db3);

    // close db handle
    fdb_kvs_close(db);

    // close db file
    fdb_close(dbfile);

    fdb_doc_free(doc);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("in-memory snapshot cleanup test");
}